

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

void PacketGet(void)

{
  FStartupScreen *pFVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ulong uStack_50;
  FString local_40;
  uLongf msgsize;
  socklen_t fromlen;
  sockaddr_in fromaddress;
  
  fromlen = 0x10;
  uStack_50 = recvfrom(mysocket,TransmitBuffer,8000,0,(sockaddr *)&fromaddress,&fromlen);
  uVar2 = FindNode(&fromaddress);
  iVar3 = (int)uStack_50;
  if (iVar3 == -1 && -1 < (int)uVar2) {
    piVar4 = __errno_location();
    pFVar1 = StartScreen;
    iVar3 = *piVar4;
    if (iVar3 == 0xb) {
      doomcom.remotenode = -1;
      return;
    }
    if (iVar3 == 0x68) {
      pcVar5 = userinfo_t::GetName((userinfo_t *)(&DAT_009ba458 + (ulong)sendplayer[uVar2] * 0x2a0))
      ;
      if (pFVar1 == (FStartupScreen *)0x0) {
        Printf("The connection from %s was dropped.\n",pcVar5);
      }
      else {
        (*pFVar1->_vptr_FStartupScreen[7])(pFVar1,"The connection from %s was dropped.\n",pcVar5);
      }
      doomcom.data[0] = 0x80;
      uStack_50 = 1;
    }
    else {
      pcVar5 = strerror(iVar3);
      I_Error("GetPacket: %s",pcVar5);
      uStack_50 = 0xffffffffffffffff;
    }
  }
  else if (iVar3 < 1 || (int)uVar2 < 0) {
    if (0 < iVar3) {
      if (((iVar3 == 2) && (TransmitBuffer[0] == '0')) && (TransmitBuffer[1] == '\x02')) {
        doomcom.remotenode = -1;
        return;
      }
      pcVar5 = inet_ntoa((in_addr)fromaddress.sin_addr.s_addr);
      DPrintf(2,"Dropped packet: Unknown host (%s:%d)\n",pcVar5,(ulong)fromaddress.sin_port);
      doomcom.remotenode = -1;
      return;
    }
  }
  else {
    doomcom.data[0] = TransmitBuffer[0] & 0xfb;
    if ((TransmitBuffer[0] & 4) == 0) {
      memcpy(doomcom.data + 1,TransmitBuffer + 1,(ulong)(iVar3 - 1));
    }
    else {
      msgsize = 13999;
      iVar3 = uncompress(0x9abf45,&msgsize,TransmitBuffer + 1,iVar3 + -1);
      if (iVar3 != 0) {
        M_ZLibError((int)&local_40);
        Printf("Net decompression failed (zlib error %s)\n",local_40.Chars);
        FString::~FString(&local_40);
        doomcom.remotenode = -1;
        return;
      }
      uStack_50 = (ulong)((int)msgsize + 1);
    }
  }
  doomcom.datalength = (SWORD)uStack_50;
  doomcom.remotenode = (SWORD)uVar2;
  return;
}

Assistant:

void PacketGet (void)
{
	int c;
	socklen_t fromlen;
	sockaddr_in fromaddress;
	int node;

	fromlen = sizeof(fromaddress);
	c = recvfrom (mysocket, (char*)TransmitBuffer, TRANSMIT_SIZE, 0,
				  (sockaddr *)&fromaddress, &fromlen);
	node = FindNode (&fromaddress);

	if (node >= 0 && c == SOCKET_ERROR)
	{
		int err = WSAGetLastError();

		if (err == WSAECONNRESET)
		{ // The remote node aborted unexpectedly, so pretend it sent an exit packet

			if (StartScreen != NULL)
			{
				StartScreen->NetMessage ("The connection from %s was dropped.\n",
					players[sendplayer[node]].userinfo.GetName());
			}
			else
			{
				Printf("The connection from %s was dropped.\n",
					players[sendplayer[node]].userinfo.GetName());
			}

			doomcom.data[0] = 0x80;	// NCMD_EXIT
			c = 1;
		}
		else if (err != WSAEWOULDBLOCK)
		{
			I_Error ("GetPacket: %s", neterror ());
		}
		else
		{
			doomcom.remotenode = -1;		// no packet
			return;
		}
	}
	else if (node >= 0 && c > 0)
	{
		doomcom.data[0] = TransmitBuffer[0] & ~NCMD_COMPRESSED;
		if (TransmitBuffer[0] & NCMD_COMPRESSED)
		{
			uLongf msgsize = MAX_MSGLEN - 1;
			int err = uncompress(doomcom.data + 1, &msgsize, TransmitBuffer + 1, c - 1);
//			Printf("recv %d/%lu\n", c, msgsize + 1);
			if (err != Z_OK)
			{
				Printf("Net decompression failed (zlib error %s)\n", M_ZLibError(err).GetChars());
				// Pretend no packet
				doomcom.remotenode = -1;
				return;
			}
			c = msgsize + 1;
		}
		else
		{
//			Printf("recv %d\n", c);
			memcpy(doomcom.data + 1, TransmitBuffer + 1, c - 1);
		}
	}
	else if (c > 0)
	{	//The packet is not from any in-game node, so we might as well discard it.
		// Don't show the message for disconnect notifications.
		if (c != 2 || TransmitBuffer[0] != PRE_FAKE || TransmitBuffer[1] != PRE_DISCONNECT)
		{
			DPrintf(DMSG_WARNING, "Dropped packet: Unknown host (%s:%d)\n", inet_ntoa(fromaddress.sin_addr), fromaddress.sin_port);
		}
		doomcom.remotenode = -1;
		return;
	}

	doomcom.remotenode = node;
	doomcom.datalength = (short)c;
}